

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cpp
# Opt level: O0

Module * mocker::buildIR(Module *__return_storage_ptr__,shared_ptr<mocker::ast::ASTRoot> *ast,
                        SemanticContext *semanticCtx)

{
  __node_base_ptr *__return_storage_ptr___00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  element_type *peVar2;
  Module *pMVar3;
  pointer pBVar4;
  string *psVar5;
  shared_ptr<mocker::ast::ASTRoot> *ast_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c0;
  string local_868;
  shared_ptr<mocker::ir::Reg> local_848;
  shared_ptr<mocker::ir::IRInst> local_838;
  shared_ptr<mocker::ir::Load> local_828;
  shared_ptr<mocker::ir::IRInst> local_818;
  allocator<char> local_801;
  string local_800 [32];
  undefined1 local_7e0 [8];
  shared_ptr<mocker::ir::Reg> funcRes_1;
  shared_ptr<mocker::ir::IntLiteral> local_7c8;
  undefined1 local_7b4 [20];
  shared_ptr<mocker::ir::IRInst> local_7a0;
  allocator<char> local_789;
  string local_788 [32];
  undefined1 local_768 [8];
  shared_ptr<mocker::ir::Reg> tmp_1;
  shared_ptr<mocker::ir::Reg> ptr_1;
  BBLIter bb_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  iterator local_710;
  size_type local_708;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_700;
  allocator<char> local_6e1;
  string local_6e0;
  undefined1 local_6c0 [8];
  FunctionModule func_1;
  shared_ptr<mocker::ir::Reg> local_5c8;
  shared_ptr<mocker::ir::IRInst> local_5b8;
  shared_ptr<mocker::ir::Load> local_5a8;
  shared_ptr<mocker::ir::IRInst> local_598;
  allocator<char> local_581;
  string local_580 [32];
  undefined1 local_560 [8];
  shared_ptr<mocker::ir::Reg> funcRes;
  shared_ptr<mocker::ir::IntLiteral> local_548;
  undefined1 local_534 [20];
  shared_ptr<mocker::ir::IRInst> local_520;
  allocator<char> local_509;
  string local_508 [32];
  undefined1 local_4e8 [8];
  shared_ptr<mocker::ir::Reg> tmp;
  shared_ptr<mocker::ir::Reg> ptr;
  BBLIter bb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  iterator local_490;
  size_type local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  allocator<char> local_461;
  string local_460;
  undefined1 local_440 [8];
  FunctionModule func;
  Builder local_360;
  undefined1 local_350 [8];
  BuilderContext IRCtx;
  shared_ptr<mocker::ast::ASTNode> local_a0;
  undefined1 local_90 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  redundantNode;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pureFuncs;
  SemanticContext *semanticCtx_local;
  shared_ptr<mocker::ast::ASTRoot> *ast_local;
  Module *res;
  
  renameASTIdentifiers
            (ast,&semanticCtx->scopeResiding,&semanticCtx->associatedDecl,&semanticCtx->exprType);
  __return_storage_ptr___00 = &redundantNode._M_h._M_single_bucket;
  findPureFunctions_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr___00,(mocker *)ast,ast_00);
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::ASTRoot,void>(&local_a0,ast);
  findRedundantNodes((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_90,&local_a0,&semanticCtx->exprType,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__return_storage_ptr___00);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_a0);
  ir::BuilderContext::BuilderContext
            ((BuilderContext *)local_350,&semanticCtx->exprType,
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)local_90);
  peVar2 = std::__shared_ptr_access<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ast);
  ir::Builder::Builder(&local_360,(BuilderContext *)local_350);
  (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
            (peVar2,&local_360.field_0x0 + *(long *)(local_360._0_8_ + -0xf0));
  func.predecessors._M_h._M_single_bucket._7_1_ = 0;
  pMVar3 = ir::BuilderContext::getResult((BuilderContext *)local_350);
  ir::Module::Module(__return_storage_ptr__,pMVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"#_array_#size",&local_461);
  bb._M_node._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"ptr",(allocator<char> *)((long)&bb._M_node + 7));
  bb._M_node._6_1_ = 0;
  local_490 = &local_4b0;
  local_488 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&bb._M_node + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_00._M_len = local_488;
  __l_00._M_array = local_490;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_480,__l_00,paVar1);
  ir::FunctionModule::FunctionModule((FunctionModule *)local_440,&local_460,&local_480,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_480);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&bb._M_node + 5));
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_490;
  do {
    local_8c0 = local_8c0 + -1;
    std::__cxx11::string::~string((string *)local_8c0);
  } while (local_8c0 != &local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bb._M_node + 7));
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ir::FunctionModule::pushBackBB((FunctionModule *)local_440);
  std::make_shared<mocker::ir::Reg,char_const(&)[2]>
            ((char (*) [2])
             &tmp.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_508,"",&local_509);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_4e8,(string *)local_440);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  local_534._0_4_ = 6;
  funcRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       8;
  std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_548);
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((shared_ptr<mocker::ir::Reg> *)(local_534 + 4),(OpType *)local_4e8,
             (shared_ptr<mocker::ir::Reg> *)local_534,
             (shared_ptr<mocker::ir::IntLiteral> *)
             &tmp.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithBinaryInst,void>
            (&local_520,(shared_ptr<mocker::ir::ArithBinaryInst> *)(local_534 + 4));
  ir::BasicBlock::appendInst(pBVar4,&local_520);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_520);
  std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
            ((shared_ptr<mocker::ir::ArithBinaryInst> *)(local_534 + 4));
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_580,"",&local_581);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_560,(string *)local_440);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::
  make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)&local_5a8,(shared_ptr<mocker::ir::Reg> *)local_560);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Load,void>(&local_598,&local_5a8);
  ir::BasicBlock::appendInst(pBVar4,&local_598);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_598);
  std::shared_ptr<mocker::ir::Load>::~shared_ptr(&local_5a8);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::make_shared<mocker::ir::Ret,std::shared_ptr<mocker::ir::Reg>&>(&local_5c8);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Ret,void>
            (&local_5b8,(shared_ptr<mocker::ir::Ret> *)&local_5c8);
  ir::BasicBlock::appendInst(pBVar4,&local_5b8);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_5b8);
  std::shared_ptr<mocker::ir::Ret>::~shared_ptr((shared_ptr<mocker::ir::Ret> *)&local_5c8);
  psVar5 = ir::FunctionModule::getIdentifier_abi_cxx11_((FunctionModule *)local_440);
  std::__cxx11::string::string
            ((string *)&func_1.predecessors._M_h._M_single_bucket,(string *)psVar5);
  ir::Module::overwriteFunc
            (__return_storage_ptr__,(string *)&func_1.predecessors._M_h._M_single_bucket,
             (FunctionModule *)local_440);
  std::__cxx11::string::~string((string *)&func_1.predecessors._M_h._M_single_bucket);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_560);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_4e8);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr
            ((shared_ptr<mocker::ir::Reg> *)
             &tmp.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::FunctionModule::~FunctionModule((FunctionModule *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"#string#length",&local_6e1);
  bb_1._M_node._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"ptr",(allocator<char> *)((long)&bb_1._M_node + 7));
  bb_1._M_node._6_1_ = 0;
  local_710 = &local_730;
  local_708 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&bb_1._M_node + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l._M_len = local_708;
  __l._M_array = local_710;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_700,__l,paVar1);
  ir::FunctionModule::FunctionModule((FunctionModule *)local_6c0,&local_6e0,&local_700,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_700);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&bb_1._M_node + 5));
  local_948 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_710;
  do {
    local_948 = local_948 + -1;
    std::__cxx11::string::~string((string *)local_948);
  } while (local_948 != &local_730);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bb_1._M_node + 7));
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  ptr_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ir::FunctionModule::pushBackBB((FunctionModule *)local_6c0);
  std::make_shared<mocker::ir::Reg,char_const(&)[2]>
            ((char (*) [2])
             &tmp_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_788,"",&local_789);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_768,(string *)local_6c0);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator(&local_789);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  local_7b4._0_4_ = 6;
  funcRes_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = 8;
  std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_7c8);
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((shared_ptr<mocker::ir::Reg> *)(local_7b4 + 4),(OpType *)local_768,
             (shared_ptr<mocker::ir::Reg> *)local_7b4,
             (shared_ptr<mocker::ir::IntLiteral> *)
             &tmp_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::ArithBinaryInst,void>
            (&local_7a0,(shared_ptr<mocker::ir::ArithBinaryInst> *)(local_7b4 + 4));
  ir::BasicBlock::appendInst(pBVar4,&local_7a0);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_7a0);
  std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
            ((shared_ptr<mocker::ir::ArithBinaryInst> *)(local_7b4 + 4));
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_800,"",&local_801);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_7e0,(string *)local_6c0);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator(&local_801);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::
  make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)&local_828,(shared_ptr<mocker::ir::Reg> *)local_7e0);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Load,void>(&local_818,&local_828);
  ir::BasicBlock::appendInst(pBVar4,&local_818);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_818);
  std::shared_ptr<mocker::ir::Load>::~shared_ptr(&local_828);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                     ((_List_iterator<mocker::ir::BasicBlock> *)
                      &ptr_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::make_shared<mocker::ir::Ret,std::shared_ptr<mocker::ir::Reg>&>(&local_848);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Ret,void>
            (&local_838,(shared_ptr<mocker::ir::Ret> *)&local_848);
  ir::BasicBlock::appendInst(pBVar4,&local_838);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_838);
  std::shared_ptr<mocker::ir::Ret>::~shared_ptr((shared_ptr<mocker::ir::Ret> *)&local_848);
  psVar5 = ir::FunctionModule::getIdentifier_abi_cxx11_((FunctionModule *)local_6c0);
  std::__cxx11::string::string((string *)&local_868,(string *)psVar5);
  ir::Module::overwriteFunc(__return_storage_ptr__,&local_868,(FunctionModule *)local_6c0);
  std::__cxx11::string::~string((string *)&local_868);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_7e0);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_768);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr
            ((shared_ptr<mocker::ir::Reg> *)
             &tmp_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::FunctionModule::~FunctionModule((FunctionModule *)local_6c0);
  func.predecessors._M_h._M_single_bucket._7_1_ = 1;
  ir::BuilderContext::~BuilderContext((BuilderContext *)local_350);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_90);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&redundantNode._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

ir::Module buildIR(const std::shared_ptr<ast::ASTRoot> &ast,
                   const SemanticContext &semanticCtx) {
  renameASTIdentifiers(ast, semanticCtx.scopeResiding,
                       semanticCtx.associatedDecl, semanticCtx.exprType);
  auto pureFuncs = findPureFunctions(ast);
  auto redundantNode = findRedundantNodes(ast, semanticCtx.exprType, pureFuncs);

  ir::BuilderContext IRCtx(semanticCtx.exprType, redundantNode);
  ast->accept(ir::Builder(IRCtx));
  auto res = IRCtx.getResult();

  // TODO: In current version, function inline must be enabled.
  // implement some simple builtin functions
  { // #_array_#size
    ir::FunctionModule func("#_array_#size", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  { // #string#length
    ir::FunctionModule func("#string#length", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  /*
  { // #string#ord ( this pos )
    ir::FunctionModule func("#string#ord", {"ptr", "pos"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto pos = std::make_shared<ir::Reg>("1");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Add, ptr, pos));
    auto loadRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(loadRes, tmp));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        funcRes, ir::ArithBinaryInst::BitAnd, loadRes,
        std::make_shared<ir::IntLiteral>(255)));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  */
  return res;
}